

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O2

bool __thiscall
BlockFilterIndex::ReadFilterFromDisk
          (BlockFilterIndex *this,FlatFilePos *pos,uint256 *hash,BlockFilter *filter)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> filter_00;
  bool bVar2;
  FILE *pFVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  Level in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  char *in_stack_fffffffffffffe20;
  pointer in_stack_fffffffffffffe28;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_178;
  AutoFile local_158;
  string log_msg;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  uint256 block_hash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = FlatFileSeq::Open((this->m_filter_fileseq)._M_t.
                             super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>
                             .super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl,pos,true);
  local_158.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.m_file = pFVar3;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_178);
  if (pFVar3 == (FILE *)0x0) {
    bVar2 = false;
  }
  else {
    block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    base_blob<256U>::Unserialize<AutoFile>(&block_hash.super_base_blob<256U>,&local_158);
    Unserialize<AutoFile,unsigned_char,std::allocator<unsigned_char>>(&local_158,&encoded_filter);
    Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((uint256 *)&log_msg,&encoded_filter);
    bVar2 = ::operator!=((base_blob<256U> *)&log_msg,&hash->super_base_blob<256U>);
    bVar2 = !bVar2;
    if (bVar2) {
      local_1b8._M_impl.super__Vector_impl_data._M_start =
           encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_1b8._M_impl.super__Vector_impl_data._M_finish =
           encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_1b8._M_impl.super__Vector_impl_data._M_end_of_storage =
           encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffe1c;
      filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffffe18;
      filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe20;
      filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe28;
      BlockFilter::BlockFilter
                ((BlockFilter *)&log_msg,this->m_filter_type,&block_hash,filter_00,
                 SUB81(&local_1b8,0));
      BlockFilter::operator=(filter,(BlockFilter *)&log_msg);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1b8);
    }
    else {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
      ;
      source_file._M_len = 99;
      logging_function._M_str = "ReadFilterFromDisk";
      logging_function._M_len = 0x12;
      ::LogPrintf_<>(logging_function,source_file,0xb0,
                     IPC|I2P|QT|LIBEVENT|PRUNE|REINDEX|SELECTCOINS|ADDRMAN|RPC|BENCH|HTTP,
                     in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  AutoFile::~AutoFile(&local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::ReadFilterFromDisk(const FlatFilePos& pos, const uint256& hash, BlockFilter& filter) const
{
    AutoFile filein{m_filter_fileseq->Open(pos, true)};
    if (filein.IsNull()) {
        return false;
    }

    // Check that the hash of the encoded_filter matches the one stored in the db.
    uint256 block_hash;
    std::vector<uint8_t> encoded_filter;
    try {
        filein >> block_hash >> encoded_filter;
        if (Hash(encoded_filter) != hash) {
            LogError("Checksum mismatch in filter decode.\n");
            return false;
        }
        filter = BlockFilter(GetFilterType(), block_hash, std::move(encoded_filter), /*skip_decode_check=*/true);
    }
    catch (const std::exception& e) {
        LogError("%s: Failed to deserialize block filter from disk: %s\n", __func__, e.what());
        return false;
    }

    return true;
}